

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestCaseGroup * vkt::api::createFeatureInfoTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> instanceInfoTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> infoTests;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"info","Platform Information Tests");
  infoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar1;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"instance","Instance Information Tests");
  instanceInfoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"physical_devices",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Physical devices",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::enumeratePhysicalDevices);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"layers",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Layers",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::enumerateInstanceLayers);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"extensions",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Extensions",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::enumerateInstanceExtensions);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  instanceInfoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(infoTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&instanceInfoTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"device","Device Information Tests");
  instanceInfoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"features",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Device Features",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceFeatures);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"properties",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Device Properties",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceProperties);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"queue_family_properties",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Queue family properties",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceQueueFamilyProperties);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"memory_properties",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Memory properties",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceMemoryProperties);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"layers",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Layers",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::enumerateDeviceLayers);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"extensions",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Extensions",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::enumerateDeviceExtensions);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  instanceInfoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(infoTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&instanceInfoTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar1 = infoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"format_properties",(allocator<char> *)&instanceInfoTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"VkGetPhysicalDeviceFormatProperties() Tests",&local_72);
  pTVar2 = &createTestGroup(testCtx,&local_50,&local_70,anon_unknown_0::createFormatTests)->
            super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = infoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"image_format_properties",(allocator<char> *)&instanceInfoTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"VkGetPhysicalDeviceImageFormatProperties() Tests",&local_72);
  pTVar2 = &createTestGroup<tcu::TestStatus(*)(vkt::Context&,vk::VkFormat,vk::VkImageType,vk::VkImageTiling)>
                      (testCtx,&local_50,&local_70,anon_unknown_0::createImageFormatTests,
                       anon_unknown_0::imageFormatProperties)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"get_physical_device_properties2",
             "VK_KHR_get_physical_device_properties2");
  instanceInfoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"features",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Extended Device Features",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceFeatures2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"properties",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Extended Device Properties",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceProperties2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"format_properties",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Extended Device Format Properties",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceFormatProperties2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"queue_family_properties",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Extended Device Queue Family Properties",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceQueueFamilyProperties2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"memory_properties",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Extended Device Memory Properties",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::deviceMemoryProperties2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  instanceInfoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(infoTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&instanceInfoTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar1 = infoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"image_format_properties2",(allocator<char> *)&instanceInfoTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"VkGetPhysicalDeviceImageFormatProperties2KHR() Tests",&local_72);
  pTVar2 = &createTestGroup<tcu::TestStatus(*)(vkt::Context&,vk::VkFormat,vk::VkImageType,vk::VkImageTiling)>
                      (testCtx,&local_50,&local_70,anon_unknown_0::createImageFormatTests,
                       anon_unknown_0::imageFormatProperties2)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = infoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"sparse_image_format_properties2",
             (allocator<char> *)&instanceInfoTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"VkGetPhysicalDeviceSparseImageFormatProperties2KHR() Tests",
             &local_72);
  pTVar2 = &createTestGroup<tcu::TestStatus(*)(vkt::Context&,vk::VkFormat,vk::VkImageType,vk::VkImageTiling)>
                      (testCtx,&local_50,&local_70,anon_unknown_0::createImageFormatTests,
                       anon_unknown_0::sparseImageFormatProperties2)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"android","Android CTS Tests");
  instanceInfoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"mandatory_extensions",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Test that all mandatory extensions are supported",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::android::testMandatoryExtensions);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"no_unknown_extensions",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Test for unknown device or instance extensions",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::android::testNoUnknownExtensions);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"no_layers",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Test that no layers are enumerated",&local_71);
  addFunctionCase(pTVar1,&local_50,&local_70,anon_unknown_0::android::testNoLayers);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = instanceInfoTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  instanceInfoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(infoTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&instanceInfoTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar1 = infoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  infoTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&infoTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createFeatureInfoTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	infoTests	(new tcu::TestCaseGroup(testCtx, "info", "Platform Information Tests"));

	{
		de::MovePtr<tcu::TestCaseGroup> instanceInfoTests	(new tcu::TestCaseGroup(testCtx, "instance", "Instance Information Tests"));

		addFunctionCase(instanceInfoTests.get(), "physical_devices",		"Physical devices",			enumeratePhysicalDevices);
		addFunctionCase(instanceInfoTests.get(), "layers",					"Layers",					enumerateInstanceLayers);
		addFunctionCase(instanceInfoTests.get(), "extensions",				"Extensions",				enumerateInstanceExtensions);

		infoTests->addChild(instanceInfoTests.release());
	}

	{
		de::MovePtr<tcu::TestCaseGroup> deviceInfoTests	(new tcu::TestCaseGroup(testCtx, "device", "Device Information Tests"));

		addFunctionCase(deviceInfoTests.get(), "features",					"Device Features",			deviceFeatures);
		addFunctionCase(deviceInfoTests.get(), "properties",				"Device Properties",		deviceProperties);
		addFunctionCase(deviceInfoTests.get(), "queue_family_properties",	"Queue family properties",	deviceQueueFamilyProperties);
		addFunctionCase(deviceInfoTests.get(), "memory_properties",			"Memory properties",		deviceMemoryProperties);
		addFunctionCase(deviceInfoTests.get(), "layers",					"Layers",					enumerateDeviceLayers);
		addFunctionCase(deviceInfoTests.get(), "extensions",				"Extensions",				enumerateDeviceExtensions);

		infoTests->addChild(deviceInfoTests.release());
	}

	infoTests->addChild(createTestGroup(testCtx, "format_properties",		"VkGetPhysicalDeviceFormatProperties() Tests",		createFormatTests));
	infoTests->addChild(createTestGroup(testCtx, "image_format_properties",	"VkGetPhysicalDeviceImageFormatProperties() Tests",	createImageFormatTests,	imageFormatProperties));

	{
		de::MovePtr<tcu::TestCaseGroup> extendedPropertiesTests (new tcu::TestCaseGroup(testCtx, "get_physical_device_properties2", "VK_KHR_get_physical_device_properties2"));

		addFunctionCase(extendedPropertiesTests.get(), "features",					"Extended Device Features",					deviceFeatures2);
		addFunctionCase(extendedPropertiesTests.get(), "properties",				"Extended Device Properties",				deviceProperties2);
		addFunctionCase(extendedPropertiesTests.get(), "format_properties",			"Extended Device Format Properties",		deviceFormatProperties2);
		addFunctionCase(extendedPropertiesTests.get(), "queue_family_properties",	"Extended Device Queue Family Properties",	deviceQueueFamilyProperties2);
		addFunctionCase(extendedPropertiesTests.get(), "memory_properties",			"Extended Device Memory Properties",		deviceMemoryProperties2);

		infoTests->addChild(extendedPropertiesTests.release());
	}

	infoTests->addChild(createTestGroup(testCtx, "image_format_properties2",		"VkGetPhysicalDeviceImageFormatProperties2KHR() Tests",			createImageFormatTests, imageFormatProperties2));
	infoTests->addChild(createTestGroup(testCtx, "sparse_image_format_properties2",	"VkGetPhysicalDeviceSparseImageFormatProperties2KHR() Tests",	createImageFormatTests, sparseImageFormatProperties2));

	{
		de::MovePtr<tcu::TestCaseGroup>	androidTests	(new tcu::TestCaseGroup(testCtx, "android", "Android CTS Tests"));

		addFunctionCase(androidTests.get(),	"mandatory_extensions",		"Test that all mandatory extensions are supported",	android::testMandatoryExtensions);
		addFunctionCase(androidTests.get(), "no_unknown_extensions",	"Test for unknown device or instance extensions",	android::testNoUnknownExtensions);
		addFunctionCase(androidTests.get(), "no_layers",				"Test that no layers are enumerated",				android::testNoLayers);

		infoTests->addChild(androidTests.release());
	}

	return infoTests.release();
}